

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonutil.cpp
# Opt level: O2

vec2f json2vec2f(Json *o)

{
  undefined8 uVar1;
  vec2f vVar2;
  undefined8 *puVar3;
  float local_38;
  float fStack_34;
  vector<float,_std::allocator<float>_> a;
  
  if ((byte)(o->m_type - number_integer) < 3) {
    local_38 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::get<float,_float,_0>(o);
    fStack_34 = local_38;
  }
  else {
    if (o->m_type != array) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "failed convert json to vec2f";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<std::vector<float,_std::allocator<float>_>,_std::vector<float,_std::allocator<float>_>,_0>
              (&a,o);
    if ((long)a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start != 8) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "vector size mismatched";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    uVar1 = *(undefined8 *)
             a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&a.super__Vector_base<float,_std::allocator<float>_>);
    local_38 = (float)uVar1;
    fStack_34 = (float)((ulong)uVar1 >> 0x20);
  }
  vVar2.y = fStack_34;
  vVar2.x = local_38;
  return vVar2;
}

Assistant:

vec2f json2vec2f(const Json& o) {
	if (is_number(o))
		return vec2f(o);
	if (o.type() != Json::value_t::array)
		throw "failed convert json to vec2f";
	std::vector<float> a = o;
	if (a.size()!=2) throw "vector size mismatched";
	return vec2f(a[0], a[1]);
}